

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSimpleUnaryExpr(CWriter *this,Opcode opcode,char *op)

{
  size_t size;
  Type type;
  Newline *in_RCX;
  char (*u) [3];
  Opcode opcode_local;
  StackVar local_38;
  StackVar local_2c;
  
  opcode_local = opcode;
  local_2c.type = Opcode::GetResultType(&opcode_local);
  local_2c.index = 0;
  local_38.index = 0;
  local_38.type.enum_ = Any;
  local_38.type.type_index_ = 0xffffffff;
  Write(this,&local_2c);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_38,u,in_RCX);
  DropTypes(this,1);
  type = Opcode::GetResultType(&opcode_local);
  PushType(this,type);
  return;
}

Assistant:

void CWriter::WriteSimpleUnaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(0, result_type), " = ", op, "(", StackVar(0), ");", Newline());
  DropTypes(1);
  PushType(opcode.GetResultType());
}